

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

void EncodeVarint(uint64_t val,string *str)

{
  char byte;
  string *str_local;
  uint64_t val_local;
  
  str_local = (string *)val;
  do {
    str_local = (string *)((ulong)str_local >> 7);
    std::__cxx11::string::push_back((char)str);
  } while (str_local != (string *)0x0);
  return;
}

Assistant:

void EncodeVarint(uint64_t val, std::string* str) {
  do {
    char byte = val & 0x7fU;
    val >>= 7;
    if (val) byte |= 0x80U;
    str->push_back(byte);
  } while (val);
}